

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclHash.c
# Opt level: O2

void Tcl_InitHashTable(Tcl_HashTable *tablePtr,int keyType)

{
  code *pcVar1;
  code *pcVar2;
  
  tablePtr->buckets = tablePtr->staticBuckets;
  tablePtr->staticBuckets[0] = (Tcl_HashEntry *)0x0;
  tablePtr->staticBuckets[1] = (Tcl_HashEntry *)0x0;
  tablePtr->staticBuckets[2] = (Tcl_HashEntry *)0x0;
  tablePtr->staticBuckets[3] = (Tcl_HashEntry *)0x0;
  tablePtr->numBuckets = 4;
  tablePtr->numEntries = 0;
  tablePtr->rebuildSize = 0xc;
  tablePtr->downShift = 0x1c;
  tablePtr->mask = 3;
  tablePtr->keyType = keyType;
  if (keyType == 0) {
    pcVar1 = StringCreate;
    pcVar2 = StringFind;
  }
  else if (keyType == 1) {
    pcVar1 = OneWordCreate;
    pcVar2 = OneWordFind;
  }
  else {
    pcVar1 = ArrayCreate;
    pcVar2 = ArrayFind;
  }
  tablePtr->findProc = pcVar2;
  tablePtr->createProc = pcVar1;
  return;
}

Assistant:

void
Tcl_InitHashTable(register Tcl_HashTable *tablePtr, int keyType)
{
    tablePtr->buckets = tablePtr->staticBuckets;
    tablePtr->staticBuckets[0] = tablePtr->staticBuckets[1] = 0;
    tablePtr->staticBuckets[2] = tablePtr->staticBuckets[3] = 0;
    tablePtr->numBuckets = TCL_SMALL_HASH_TABLE;
    tablePtr->numEntries = 0;
    tablePtr->rebuildSize = TCL_SMALL_HASH_TABLE * REBUILD_MULTIPLIER;
    tablePtr->downShift = 28;
    tablePtr->mask = 3;
    tablePtr->keyType = keyType;
    if (keyType == TCL_STRING_KEYS) {
	tablePtr->findProc = StringFind;
	tablePtr->createProc = StringCreate;
    } else if (keyType == TCL_ONE_WORD_KEYS) {
	tablePtr->findProc = OneWordFind;
	tablePtr->createProc = OneWordCreate;
    } else {
	tablePtr->findProc = ArrayFind;
	tablePtr->createProc = ArrayCreate;
    };
}